

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O0

void draw_particles(GLFWwindow *window,double t,float dt)

{
  undefined4 uVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 local_1af0 [8];
  timespec ts;
  PARTICLE *pptr;
  GLfloat mat [16];
  Vec3 quad_lower_right;
  Vec3 quad_lower_left;
  GLuint rgba;
  float alpha;
  Vertex *vptr;
  Vertex vertex_array [280];
  int local_20;
  int particle_count;
  int i;
  float dt_local;
  double t_local;
  GLFWwindow *window_local;
  
  glGetFloatv(0xba6,&pptr);
  fVar3 = (pptr._0_4_ + pptr._4_4_) * -0.35;
  fVar4 = (mat[2] + mat[3]) * -0.35;
  fVar5 = (mat[6] + mat[7]) * -0.35;
  fVar6 = (pptr._0_4_ - pptr._4_4_) * 0.35;
  fVar7 = (mat[2] - mat[3]) * 0.35;
  fVar8 = (mat[6] - mat[7]) * 0.35;
  glDepthMask(0);
  glEnable(0xbe2);
  glBlendFunc(0x302,1);
  if (wireframe == 0) {
    glEnable(0xde1);
    glBindTexture(0xde1,particle_tex_id);
  }
  glInterleavedArrays(0x2a29,0,&vptr);
  mtx_lock(&thread_sync.particles_lock);
  while (iVar2 = glfwWindowShouldClose(window),
        iVar2 == 0 && thread_sync.p_frame <= thread_sync.d_frame) {
    clock_gettime(0,(timespec *)local_1af0);
    ts.tv_sec = ts.tv_sec + 100000000;
    cnd_timedwait(&thread_sync.p_done,&thread_sync.particles_lock,(timespec *)local_1af0);
  }
  thread_sync.d_frame = thread_sync.d_frame + 1;
  vertex_array[0x117].z = 0.0;
  _rgba = &vptr;
  ts.tv_nsec = (__syscall_slong_t)particles;
  thread_sync.t = t;
  thread_sync.dt = dt;
  for (local_20 = 0; local_20 < 3000; local_20 = local_20 + 1) {
    if (*(int *)(ts.tv_nsec + 0x28) != 0) {
      quad_lower_left.z = *(float *)(ts.tv_nsec + 0x24) * 4.0;
      if (1.0 < quad_lower_left.z) {
        quad_lower_left.z = 1.0;
      }
      uVar1 = CONCAT13((char)(int)(quad_lower_left.z * 255.0),
                       CONCAT12((char)(int)(*(float *)(ts.tv_nsec + 0x20) * 255.0),
                                CONCAT11((char)(int)(*(float *)(ts.tv_nsec + 0x1c) * 255.0),
                                         (char)(int)(*(float *)(ts.tv_nsec + 0x18) * 255.0))));
      *(undefined4 *)_rgba = 0;
      *(undefined4 *)((long)_rgba + 4) = 0;
      *(undefined4 *)(_rgba + 1) = uVar1;
      *(float *)((long)_rgba + 0xc) = *(float *)ts.tv_nsec + fVar3;
      *(float *)(_rgba + 2) = *(float *)(ts.tv_nsec + 4) + fVar4;
      *(float *)((long)_rgba + 0x14) = *(float *)(ts.tv_nsec + 8) + fVar5;
      *(undefined4 *)(_rgba + 3) = 0x3f800000;
      *(undefined4 *)((long)_rgba + 0x1c) = 0;
      *(undefined4 *)(_rgba + 4) = uVar1;
      *(float *)((long)_rgba + 0x24) = *(float *)ts.tv_nsec + fVar6;
      *(float *)(_rgba + 5) = *(float *)(ts.tv_nsec + 4) + fVar7;
      *(float *)((long)_rgba + 0x2c) = *(float *)(ts.tv_nsec + 8) + fVar8;
      *(undefined4 *)(_rgba + 6) = 0x3f800000;
      *(undefined4 *)((long)_rgba + 0x34) = 0x3f800000;
      *(undefined4 *)(_rgba + 7) = uVar1;
      *(float *)((long)_rgba + 0x3c) = *(float *)ts.tv_nsec - fVar3;
      *(float *)(_rgba + 8) = *(float *)(ts.tv_nsec + 4) - fVar4;
      *(float *)((long)_rgba + 0x44) = *(float *)(ts.tv_nsec + 8) - fVar5;
      *(undefined4 *)(_rgba + 9) = 0;
      *(undefined4 *)((long)_rgba + 0x4c) = 0x3f800000;
      *(undefined4 *)(_rgba + 10) = uVar1;
      *(float *)((long)_rgba + 0x54) = *(float *)ts.tv_nsec - fVar6;
      *(float *)(_rgba + 0xb) = *(float *)(ts.tv_nsec + 4) - fVar7;
      *(float *)((long)_rgba + 0x5c) = *(float *)(ts.tv_nsec + 8) - fVar8;
      _rgba = _rgba + 0xc;
      vertex_array[0x117].z = (GLfloat)((int)vertex_array[0x117].z + 1);
    }
    if (0x45 < (int)vertex_array[0x117].z) {
      glDrawArrays(7,0,(int)vertex_array[0x117].z << 2);
      vertex_array[0x117].z = 0.0;
      _rgba = &vptr;
    }
    ts.tv_nsec = ts.tv_nsec + 0x2c;
  }
  mtx_unlock(&thread_sync.particles_lock);
  cnd_signal(&thread_sync.d_done);
  glDrawArrays(7,0,(int)vertex_array[0x117].z << 2);
  glDisableClientState(0x8074);
  glDisableClientState(0x8078);
  glDisableClientState(0x8076);
  glDisable(0xde1);
  glDisable(0xbe2);
  glDepthMask(1);
  return;
}

Assistant:

static void draw_particles(GLFWwindow* window, double t, float dt)
{
    int i, particle_count;
    Vertex vertex_array[BATCH_PARTICLES * PARTICLE_VERTS];
    Vertex* vptr;
    float alpha;
    GLuint rgba;
    Vec3 quad_lower_left, quad_lower_right;
    GLfloat mat[16];
    PARTICLE* pptr;

    // Here comes the real trick with flat single primitive objects (s.c.
    // "billboards"): We must rotate the textured primitive so that it
    // always faces the viewer (is coplanar with the view-plane).
    // We:
    //   1) Create the primitive around origo (0,0,0)
    //   2) Rotate it so that it is coplanar with the view plane
    //   3) Translate it according to the particle position
    // Note that 1) and 2) is the same for all particles (done only once).

    // Get modelview matrix. We will only use the upper left 3x3 part of
    // the matrix, which represents the rotation.
    glGetFloatv(GL_MODELVIEW_MATRIX, mat);

    // 1) & 2) We do it in one swift step:
    // Although not obvious, the following six lines represent two matrix/
    // vector multiplications. The matrix is the inverse 3x3 rotation
    // matrix (i.e. the transpose of the same matrix), and the two vectors
    // represent the lower left corner of the quad, PARTICLE_SIZE/2 *
    // (-1,-1,0), and the lower right corner, PARTICLE_SIZE/2 * (1,-1,0).
    // The upper left/right corners of the quad is always the negative of
    // the opposite corners (regardless of rotation).
    quad_lower_left.x = (-PARTICLE_SIZE / 2) * (mat[0] + mat[1]);
    quad_lower_left.y = (-PARTICLE_SIZE / 2) * (mat[4] + mat[5]);
    quad_lower_left.z = (-PARTICLE_SIZE / 2) * (mat[8] + mat[9]);
    quad_lower_right.x = (PARTICLE_SIZE / 2) * (mat[0] - mat[1]);
    quad_lower_right.y = (PARTICLE_SIZE / 2) * (mat[4] - mat[5]);
    quad_lower_right.z = (PARTICLE_SIZE / 2) * (mat[8] - mat[9]);

    // Don't update z-buffer, since all particles are transparent!
    glDepthMask(GL_FALSE);

    glEnable(GL_BLEND);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE);

    // Select particle texture
    if (!wireframe)
    {
        glEnable(GL_TEXTURE_2D);
        glBindTexture(GL_TEXTURE_2D, particle_tex_id);
    }

    // Set up vertex arrays. We use interleaved arrays, which is easier to
    // handle (in most situations) and it gives a linear memeory access
    // access pattern (which may give better performance in some
    // situations). GL_T2F_C4UB_V3F means: 2 floats for texture coords,
    // 4 ubytes for color and 3 floats for vertex coord (in that order).
    // Most OpenGL cards / drivers are optimized for this format.
    glInterleavedArrays(GL_T2F_C4UB_V3F, 0, vertex_array);

    // Wait for particle physics thread to be done
    mtx_lock(&thread_sync.particles_lock);
    while (!glfwWindowShouldClose(window) &&
            thread_sync.p_frame <= thread_sync.d_frame)
    {
        struct timespec ts;
        clock_gettime(CLOCK_REALTIME, &ts);
        ts.tv_nsec += 100000000;
        cnd_timedwait(&thread_sync.p_done, &thread_sync.particles_lock, &ts);
    }

    // Store the frame time and delta time for the physics thread
    thread_sync.t = t;
    thread_sync.dt = dt;

    // Update frame counter
    thread_sync.d_frame++;

    // Loop through all particles and build vertex arrays.
    particle_count = 0;
    vptr = vertex_array;
    pptr = particles;

    for (i = 0;  i < MAX_PARTICLES;  i++)
    {
        if (pptr->active)
        {
            // Calculate particle intensity (we set it to max during 75%
            // of its life, then it fades out)
            alpha =  4.f * pptr->life;
            if (alpha > 1.f)
                alpha = 1.f;

            // Convert color from float to 8-bit (store it in a 32-bit
            // integer using endian independent type casting)
            ((GLubyte*) &rgba)[0] = (GLubyte)(pptr->r * 255.f);
            ((GLubyte*) &rgba)[1] = (GLubyte)(pptr->g * 255.f);
            ((GLubyte*) &rgba)[2] = (GLubyte)(pptr->b * 255.f);
            ((GLubyte*) &rgba)[3] = (GLubyte)(alpha * 255.f);

            // 3) Translate the quad to the correct position in modelview
            // space and store its parameters in vertex arrays (we also
            // store texture coord and color information for each vertex).

            // Lower left corner
            vptr->s    = 0.f;
            vptr->t    = 0.f;
            vptr->rgba = rgba;
            vptr->x    = pptr->x + quad_lower_left.x;
            vptr->y    = pptr->y + quad_lower_left.y;
            vptr->z    = pptr->z + quad_lower_left.z;
            vptr ++;

            // Lower right corner
            vptr->s    = 1.f;
            vptr->t    = 0.f;
            vptr->rgba = rgba;
            vptr->x    = pptr->x + quad_lower_right.x;
            vptr->y    = pptr->y + quad_lower_right.y;
            vptr->z    = pptr->z + quad_lower_right.z;
            vptr ++;

            // Upper right corner
            vptr->s    = 1.f;
            vptr->t    = 1.f;
            vptr->rgba = rgba;
            vptr->x    = pptr->x - quad_lower_left.x;
            vptr->y    = pptr->y - quad_lower_left.y;
            vptr->z    = pptr->z - quad_lower_left.z;
            vptr ++;

            // Upper left corner
            vptr->s    = 0.f;
            vptr->t    = 1.f;
            vptr->rgba = rgba;
            vptr->x    = pptr->x - quad_lower_right.x;
            vptr->y    = pptr->y - quad_lower_right.y;
            vptr->z    = pptr->z - quad_lower_right.z;
            vptr ++;

            // Increase count of drawable particles
            particle_count ++;
        }

        // If we have filled up one batch of particles, draw it as a set
        // of quads using glDrawArrays.
        if (particle_count >= BATCH_PARTICLES)
        {
            // The first argument tells which primitive type we use (QUAD)
            // The second argument tells the index of the first vertex (0)
            // The last argument is the vertex count
            glDrawArrays(GL_QUADS, 0, PARTICLE_VERTS * particle_count);
            particle_count = 0;
            vptr = vertex_array;
        }

        // Next particle
        pptr++;
    }

    // We are done with the particle data
    mtx_unlock(&thread_sync.particles_lock);
    cnd_signal(&thread_sync.d_done);

    // Draw final batch of particles (if any)
    glDrawArrays(GL_QUADS, 0, PARTICLE_VERTS * particle_count);

    // Disable vertex arrays (Note: glInterleavedArrays implicitly called
    // glEnableClientState for vertex, texture coord and color arrays)
    glDisableClientState(GL_VERTEX_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_COLOR_ARRAY);

    glDisable(GL_TEXTURE_2D);
    glDisable(GL_BLEND);

    glDepthMask(GL_TRUE);
}